

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int __thiscall Json::Value::asInt(Value *this)

{
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._4_4_ = 0;
    break;
  case 1:
    this_local._4_4_ = (this->value_).int_;
    break;
  case 2:
    if (0x7ffffffe < (this->value_).uint_) {
      jbcoin::Throw<std::runtime_error,char_const(&)[36]>
                ((char (*) [36])"integer out of signed integer range");
    }
    this_local._4_4_ = (this->value_).int_;
    break;
  case 3:
    if (((this->value_).real_ < -2147483648.0) || (2147483647.0 < (this->value_).real_)) {
      jbcoin::Throw<std::runtime_error,char_const(&)[33]>
                ((char (*) [33])"Real out of signed integer range");
    }
    this_local._4_4_ = (uint)(this->value_).real_;
    break;
  case 4:
    this_local._4_4_ = beast::lexicalCastThrow<int,char*>((this->value_).string_);
    break;
  case 5:
    this_local._4_4_ = (uint)(((this->value_).bool_ & 1U) != 0);
    break;
  case 6:
  case 7:
    jbcoin::Throw<std::runtime_error,char_const(&)[31]>
              ((char (*) [31])"Type is not convertible to int");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x23b,"Value::Int Json::Value::asInt() const");
  }
  return this_local._4_4_;
}

Assistant:

Value::Int
Value::asInt () const
{
    switch ( type_ )
    {
    case nullValue:
        return 0;

    case intValue:
        return value_.int_;

    case uintValue:
        JSON_ASSERT_MESSAGE ( value_.uint_ < (unsigned)maxInt, "integer out of signed integer range" );
        return value_.uint_;

    case realValue:
        JSON_ASSERT_MESSAGE ( value_.real_ >= minInt  &&  value_.real_ <= maxInt, "Real out of signed integer range" );
        return Int ( value_.real_ );

    case booleanValue:
        return value_.bool_ ? 1 : 0;

    case stringValue:
        return beast::lexicalCastThrow <int> (value_.string_);

    case arrayValue:
    case objectValue:
        JSON_ASSERT_MESSAGE ( false, "Type is not convertible to int" );

    default:
        JSON_ASSERT_UNREACHABLE;
    }

    return 0; // unreachable;
}